

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::SingularFieldHelper<11>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  ArrayOutput *in_RCX;
  
  WriteTagTo<google::protobuf::internal::ArrayOutput>(md->tag,output);
  SerializeMessageTo<google::protobuf::internal::ArrayOutput>
            (*field,(MessageLite *)md->ptr,output,in_RCX);
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    WriteTagTo(md.tag, output);
    SerializeMessageTo(Get<const MessageLite*>(field),
                       static_cast<const SerializationTable*>(md.ptr), output);
  }